

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall
mkvmuxer::Segment::AddFrameWithAdditional
          (Segment *this,uint8_t *data,uint64_t length,uint8_t *additional,
          uint64_t additional_length,uint64_t add_id,uint64_t track_number,uint64_t timestamp,
          bool is_key)

{
  bool bVar1;
  bool bVar2;
  Frame local_98;
  
  if (additional == (uint8_t *)0x0 || data == (uint8_t *)0x0) {
    bVar2 = false;
  }
  else {
    local_98.frame_ = (uint8_t *)0x0;
    bVar2 = false;
    local_98.is_key_ = false;
    local_98.add_id_ = 0;
    local_98.additional_ = (uint8_t *)0x0;
    local_98.additional_length_ = 0;
    local_98.duration_ = 0;
    local_98.duration_set_ = false;
    local_98.length_ = 0;
    local_98.track_number_ = 0;
    local_98.timestamp_ = 0;
    local_98.discard_padding_._0_1_ = 0;
    local_98.discard_padding_._1_7_ = 0;
    local_98.reference_block_timestamp_._0_1_ = 0;
    local_98._89_8_ = 0;
    bVar1 = Frame::Init(&local_98,data,length);
    if (bVar1) {
      bVar2 = Frame::AddAdditionalData(&local_98,additional,additional_length,add_id);
      if (bVar2) {
        local_98.track_number_ = track_number;
        local_98.timestamp_ = timestamp;
        local_98.is_key_ = is_key;
        bVar2 = AddGenericFrame(this,&local_98);
      }
      else {
        bVar2 = false;
      }
    }
    Frame::~Frame(&local_98);
  }
  return bVar2;
}

Assistant:

bool Segment::AddFrameWithAdditional(const uint8_t* data, uint64_t length,
                                     const uint8_t* additional,
                                     uint64_t additional_length,
                                     uint64_t add_id, uint64_t track_number,
                                     uint64_t timestamp, bool is_key) {
  if (!data || !additional)
    return false;

  Frame frame;
  if (!frame.Init(data, length) ||
      !frame.AddAdditionalData(additional, additional_length, add_id)) {
    return false;
  }
  frame.set_track_number(track_number);
  frame.set_timestamp(timestamp);
  frame.set_is_key(is_key);
  return AddGenericFrame(&frame);
}